

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double __thiscall r_exec::View::update_res(View *this)

{
  uint64_t uVar1;
  Atom *this_00;
  float fVar2;
  View *pVVar3;
  double dVar4;
  undefined1 auVar5 [16];
  Atom local_24 [4];
  View *local_20;
  double new_res;
  View *this_local;
  
  new_res = (double)this;
  fVar2 = get_res(this);
  pVVar3 = (View *)(double)fVar2;
  local_20 = pVVar3;
  dVar4 = std::numeric_limits<double>::infinity();
  if (((double)pVVar3 != dVar4) || (NAN((double)pVVar3) || NAN(dVar4))) {
    if ((this->res_changes != 0) && ((this->acc_res != 0.0 || (NAN(this->acc_res))))) {
      fVar2 = get_res(this);
      uVar1 = this->res_changes;
      auVar5._8_4_ = (int)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      local_20 = (View *)((double)fVar2 +
                         (double)this->acc_res /
                         ((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
    }
    local_20 = (View *)((double)local_20 + -1.0);
    if ((double)local_20 < 0.0) {
      local_20 = (View *)0x0;
    }
    r_code::Atom::Float((float)(double)local_20);
    this_00 = r_code::View::code(&this->super_View,4);
    r_code::Atom::operator=(this_00,local_24);
    r_code::Atom::~Atom(local_24);
    this->acc_res = 0.0;
    this->res_changes = 0;
    fVar2 = get_res(this);
    this_local = (View *)(double)fVar2;
  }
  else {
    this_local = local_20;
  }
  return (double)this_local;
}

Assistant:

double View::update_res()
{
    double new_res = get_res();

    if (new_res == std::numeric_limits<double>::infinity()) {
        return new_res;
    }

    if (res_changes > 0 && acc_res != 0) {
        new_res = get_res() + (double)acc_res / (double)res_changes;
    }

    if (--new_res < 0) { // decremented by one on behalf of the group (at upr).
        new_res = 0;
    }

    code(VIEW_RES) = r_code::Atom::Float(new_res);
    acc_res = 0;
    res_changes = 0;
    return get_res();
}